

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Performance::lightVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLights,bool isVertexCase,
          LightType lightType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  ulong *puVar4;
  size_type *psVar5;
  long *plVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  string ndxStr;
  ostringstream s;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  string *local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  byte local_341;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  int local_320;
  int local_31c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  int local_2f4;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  ios_base local_160 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_31c = (int)CONCAT71(in_register_00000009,isVertexCase);
  local_320 = (int)this;
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_3f0 = __return_storage_ptr__;
  local_2f4 = numLights;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (0 < local_320) {
    paVar1 = &local_388.field_2;
    iVar7 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
      std::ostream::operator<<((ostringstream *)&local_1d0,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
      std::ios_base::~ios_base(local_160);
      std::operator+(&local_3c8,"uniform mediump vec3 u_light",&local_3e8);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
      local_410 = &local_400;
      puVar4 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar4) {
        local_400 = *puVar4;
        lStack_3f8 = plVar2[3];
      }
      else {
        local_400 = *puVar4;
        local_410 = (ulong *)*plVar2;
      }
      local_408 = plVar2[1];
      *plVar2 = (long)puVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_3e8._M_dataplus._M_p)
      ;
      psVar5 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_388.field_2._M_allocated_capacity = *psVar5;
        local_388.field_2._8_8_ = puVar3[3];
        local_388._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_388.field_2._M_allocated_capacity = *psVar5;
        local_388._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_388._M_string_length = puVar3[1];
      *puVar3 = psVar5;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_1c0 = *plVar6;
        lStack_1b8 = plVar2[3];
        local_1d0 = &local_1c0;
      }
      else {
        local_1c0 = *plVar6;
        local_1d0 = (long *)*plVar2;
      }
      local_1c8 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar1) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,local_400 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if (local_31c == 1) {
        std::operator+(&local_318,"uniform mediump vec4 u_light",&local_3e8);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_340 = &local_330;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_330 = *plVar6;
          lStack_328 = plVar2[3];
        }
        else {
          local_330 = *plVar6;
          local_340 = (long *)*plVar2;
        }
        local_338 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_340,(ulong)local_3e8._M_dataplus._M_p);
        local_3a8 = &local_398;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_398 = *puVar4;
          lStack_390 = plVar2[3];
        }
        else {
          local_398 = *puVar4;
          local_3a8 = (ulong *)*plVar2;
        }
        local_3a0 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_368 = &local_358;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_358 = *plVar6;
          lStack_350 = plVar2[3];
        }
        else {
          local_358 = *plVar6;
          local_368 = (long *)*plVar2;
        }
        local_360 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_368,(ulong)local_3e8._M_dataplus._M_p);
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_3c8.field_2._M_allocated_capacity = *psVar5;
          local_3c8.field_2._8_8_ = plVar2[3];
        }
        else {
          local_3c8.field_2._M_allocated_capacity = *psVar5;
          local_3c8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_3c8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_410 = &local_400;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_400 = *puVar4;
          lStack_3f8 = plVar2[3];
        }
        else {
          local_400 = *puVar4;
          local_410 = (ulong *)*plVar2;
        }
        local_408 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_410,(ulong)local_3e8._M_dataplus._M_p);
        psVar5 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_388.field_2._M_allocated_capacity = *psVar5;
          local_388.field_2._8_8_ = puVar3[3];
          local_388._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_388.field_2._M_allocated_capacity = *psVar5;
          local_388._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_388._M_string_length = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_1c0 = *plVar6;
          lStack_1b8 = plVar2[3];
          local_1d0 = &local_1c0;
        }
        else {
          local_1c0 = *plVar6;
          local_1d0 = (long *)*plVar2;
        }
        local_1c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0,local_1c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != paVar1) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (local_410 != &local_400) {
          operator_delete(local_410,local_400 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340,local_330 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      iVar7 = iVar7 + 1;
    } while (local_320 != iVar7);
  }
  std::__cxx11::string::append((char *)local_3f0);
  if (((byte)local_2f4 != '\0') || (std::__cxx11::string::append((char *)local_3f0), local_31c != 1)
     ) goto LAB_01309cac;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
  std::ostream::operator<<(&local_1d0,local_320);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
  std::ios_base::~ios_base(local_160);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x1c5ed9e);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_3c8.field_2._M_allocated_capacity = *psVar5;
    local_3c8.field_2._8_8_ = plVar2[3];
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  }
  else {
    local_3c8.field_2._M_allocated_capacity = *psVar5;
    local_3c8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_3c8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_400 = *puVar4;
    lStack_3f8 = plVar2[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar4;
    local_410 = (ulong *)*plVar2;
  }
  local_408 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
  std::ostream::operator<<(&local_1d0,local_320);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
  std::ios_base::~ios_base(local_160);
  uVar8 = 0xf;
  if (local_410 != &local_400) {
    uVar8 = local_400;
  }
  if (uVar8 < (ulong)(local_3a0 + local_408)) {
    uVar8 = 0xf;
    if (local_3a8 != &local_398) {
      uVar8 = local_398;
    }
    if (uVar8 < (ulong)(local_3a0 + local_408)) goto LAB_01309b22;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_410);
  }
  else {
LAB_01309b22:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_3a8);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  psVar5 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388.field_2._8_8_ = puVar3[3];
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar5;
    local_388._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_388._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)psVar5 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_3e8.field_2._M_allocated_capacity = *psVar5;
    local_3e8.field_2._8_8_ = plVar2[3];
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  }
  else {
    local_3e8.field_2._M_allocated_capacity = *psVar5;
    local_3e8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_3e8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_3e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,local_398 + 1);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
LAB_01309cac:
  std::__cxx11::string::append((char *)local_3f0);
  if (local_31c == 1) {
    std::__cxx11::string::append((char *)local_3f0);
  }
  std::__cxx11::string::append((char *)local_3f0);
  if ((byte)local_2f4 == '\0') {
    std::__cxx11::string::append((char *)local_3f0);
  }
  std::__cxx11::string::append((char *)local_3f0);
  if (0 < local_320) {
    paVar1 = &local_388.field_2;
    local_341 = local_31c == 0 & (byte)local_2f4;
    iVar7 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
      std::ostream::operator<<((ostringstream *)&local_1d0,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
      std::ios_base::~ios_base(local_160);
      std::operator+(&local_388,"\t/* Light ",&local_3e8);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_1c0 = *plVar6;
        lStack_1b8 = plVar2[3];
        local_1d0 = &local_1c0;
      }
      else {
        local_1c0 = *plVar6;
        local_1d0 = (long *)*plVar2;
      }
      local_1c8 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar1) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if (local_31c == 1) {
        std::operator+(&local_318,"\tmediump float distanceToLight",&local_3e8);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_340 = &local_330;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_330 = *plVar6;
          lStack_328 = plVar2[3];
        }
        else {
          local_330 = *plVar6;
          local_340 = (long *)*plVar2;
        }
        local_338 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_340,(ulong)local_3e8._M_dataplus._M_p);
        local_3a8 = &local_398;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_398 = *puVar4;
          lStack_390 = plVar2[3];
        }
        else {
          local_398 = *puVar4;
          local_3a8 = (ulong *)*plVar2;
        }
        local_3a0 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_368 = &local_358;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_358 = *plVar6;
          lStack_350 = plVar2[3];
        }
        else {
          local_358 = *plVar6;
          local_368 = (long *)*plVar2;
        }
        local_360 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_368,(ulong)local_3e8._M_dataplus._M_p);
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_3c8.field_2._M_allocated_capacity = *psVar5;
          local_3c8.field_2._8_8_ = plVar2[3];
        }
        else {
          local_3c8.field_2._M_allocated_capacity = *psVar5;
          local_3c8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_3c8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_410 = &local_400;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_400 = *puVar4;
          lStack_3f8 = plVar2[3];
        }
        else {
          local_400 = *puVar4;
          local_410 = (ulong *)*plVar2;
        }
        local_408 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_410,(ulong)local_3e8._M_dataplus._M_p);
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_388.field_2._M_allocated_capacity = *psVar5;
          local_388.field_2._8_8_ = plVar2[3];
          local_388._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_388.field_2._M_allocated_capacity = *psVar5;
          local_388._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_388._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_1c0 = *plVar6;
          lStack_1b8 = plVar2[3];
          local_1d0 = &local_1c0;
        }
        else {
          local_1c0 = *plVar6;
          local_1d0 = (long *)*plVar2;
        }
        local_1c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0,local_1c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != paVar1) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (local_410 != &local_400) {
          operator_delete(local_410,local_400 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340,local_330 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((byte)local_2f4 == '\0') {
          std::operator+(&local_318,"\tv_directionToLight${NAME_SPEC}[",&local_3e8);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
          local_340 = &local_330;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_330 = *plVar6;
            lStack_328 = plVar2[3];
          }
          else {
            local_330 = *plVar6;
            local_340 = (long *)*plVar2;
          }
          local_338 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_340,(ulong)local_3e8._M_dataplus._M_p);
          local_3a8 = &local_398;
          puVar4 = (ulong *)(plVar2 + 2);
          if ((ulong *)*plVar2 == puVar4) {
            local_398 = *puVar4;
            lStack_390 = plVar2[3];
          }
          else {
            local_398 = *puVar4;
            local_3a8 = (ulong *)*plVar2;
          }
          local_3a0 = plVar2[1];
          *plVar2 = (long)puVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a8);
          local_368 = &local_358;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_358 = *plVar6;
            lStack_350 = plVar2[3];
          }
          else {
            local_358 = *plVar6;
            local_368 = (long *)*plVar2;
          }
          local_360 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_368,(ulong)local_3e8._M_dataplus._M_p);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_3c8.field_2._M_allocated_capacity = *psVar5;
            local_3c8.field_2._8_8_ = plVar2[3];
          }
          else {
            local_3c8.field_2._M_allocated_capacity = *psVar5;
            local_3c8._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_3c8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
          local_410 = &local_400;
          puVar4 = (ulong *)(plVar2 + 2);
          if ((ulong *)*plVar2 == puVar4) {
            local_400 = *puVar4;
            lStack_3f8 = plVar2[3];
          }
          else {
            local_400 = *puVar4;
            local_410 = (ulong *)*plVar2;
          }
          local_408 = plVar2[1];
          *plVar2 = (long)puVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_410,(ulong)local_3e8._M_dataplus._M_p);
          psVar5 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_388.field_2._M_allocated_capacity = *psVar5;
            local_388.field_2._8_8_ = puVar3[3];
            local_388._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_388.field_2._M_allocated_capacity = *psVar5;
            local_388._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_388._M_string_length = puVar3[1];
          *puVar3 = psVar5;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_1c0 = *plVar6;
            lStack_1b8 = plVar2[3];
            local_1d0 = &local_1c0;
          }
          else {
            local_1c0 = *plVar6;
            local_1d0 = (long *)*plVar2;
          }
          local_1c8 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != paVar1) {
            operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
          }
          if (local_410 != &local_400) {
            operator_delete(local_410,local_400 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if (local_368 != &local_358) {
            operator_delete(local_368,local_358 + 1);
          }
          if (local_3a8 != &local_398) {
            operator_delete(local_3a8,local_398 + 1);
          }
          if (local_340 != &local_330) {
            operator_delete(local_340,local_330 + 1);
          }
          uVar9 = local_318.field_2._M_allocated_capacity;
          _Var10._M_p = local_318._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) goto LAB_0130b754;
        }
        else {
          std::operator+(&local_50,"\tmediump vec3 halfVector",&local_3e8);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_230 = &local_220;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_220 = *plVar6;
            lStack_218 = plVar2[3];
          }
          else {
            local_220 = *plVar6;
            local_230 = (long *)*plVar2;
          }
          local_228 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_230,(ulong)local_3e8._M_dataplus._M_p);
          local_210 = &local_200;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_200 = *plVar6;
            lStack_1f8 = plVar2[3];
          }
          else {
            local_200 = *plVar6;
            local_210 = (long *)*plVar2;
          }
          local_208 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
          local_1f0 = &local_1e0;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_1e0 = *plVar6;
            lStack_1d8 = plVar2[3];
          }
          else {
            local_1e0 = *plVar6;
            local_1f0 = (long *)*plVar2;
          }
          local_1e8 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1f0,(ulong)local_3e8._M_dataplus._M_p);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_250.field_2._M_allocated_capacity = *psVar5;
            local_250.field_2._8_8_ = plVar2[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar5;
            local_250._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_250._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
          local_2f0 = &local_2e0;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_2e0 = *plVar6;
            lStack_2d8 = plVar2[3];
          }
          else {
            local_2e0 = *plVar6;
            local_2f0 = (long *)*plVar2;
          }
          local_2e8 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2f0,(ulong)local_3e8._M_dataplus._M_p);
          local_2d0 = &local_2c0;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_2c0 = *plVar6;
            lStack_2b8 = plVar2[3];
          }
          else {
            local_2c0 = *plVar6;
            local_2d0 = (long *)*plVar2;
          }
          local_2c8 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0 = &local_2a0;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_2a0 = *plVar6;
            lStack_298 = plVar2[3];
          }
          else {
            local_2a0 = *plVar6;
            local_2b0 = (long *)*plVar2;
          }
          local_2a8 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2b0,(ulong)local_3e8._M_dataplus._M_p);
          local_290 = &local_280;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_280 = *plVar6;
            lStack_278 = plVar2[3];
          }
          else {
            local_280 = *plVar6;
            local_290 = (long *)*plVar2;
          }
          local_288 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_290);
          local_270 = &local_260;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_260 = *plVar6;
            lStack_258 = plVar2[3];
          }
          else {
            local_260 = *plVar6;
            local_270 = (long *)*plVar2;
          }
          local_268 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_270,(ulong)local_3e8._M_dataplus._M_p);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_318.field_2._M_allocated_capacity = *psVar5;
            local_318.field_2._8_8_ = plVar2[3];
          }
          else {
            local_318.field_2._M_allocated_capacity = *psVar5;
            local_318._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_318._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
          local_340 = &local_330;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_330 = *plVar6;
            lStack_328 = plVar2[3];
          }
          else {
            local_330 = *plVar6;
            local_340 = (long *)*plVar2;
          }
          local_338 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_340,(ulong)local_3e8._M_dataplus._M_p);
          local_3a8 = &local_398;
          puVar4 = (ulong *)(plVar2 + 2);
          if ((ulong *)*plVar2 == puVar4) {
            local_398 = *puVar4;
            lStack_390 = plVar2[3];
          }
          else {
            local_398 = *puVar4;
            local_3a8 = (ulong *)*plVar2;
          }
          local_3a0 = plVar2[1];
          *plVar2 = (long)puVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a8);
          local_368 = &local_358;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_358 = *plVar6;
            lStack_350 = plVar2[3];
          }
          else {
            local_358 = *plVar6;
            local_368 = (long *)*plVar2;
          }
          local_360 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_368,(ulong)local_3e8._M_dataplus._M_p);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_3c8.field_2._M_allocated_capacity = *psVar5;
            local_3c8.field_2._8_8_ = plVar2[3];
          }
          else {
            local_3c8.field_2._M_allocated_capacity = *psVar5;
            local_3c8._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_3c8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
          local_410 = &local_400;
          puVar4 = (ulong *)(plVar2 + 2);
          if ((ulong *)*plVar2 == puVar4) {
            local_400 = *puVar4;
            lStack_3f8 = plVar2[3];
          }
          else {
            local_400 = *puVar4;
            local_410 = (ulong *)*plVar2;
          }
          local_408 = plVar2[1];
          *plVar2 = (long)puVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_410,(ulong)local_3e8._M_dataplus._M_p);
          psVar5 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_388.field_2._M_allocated_capacity = *psVar5;
            local_388.field_2._8_8_ = puVar3[3];
            local_388._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_388.field_2._M_allocated_capacity = *psVar5;
            local_388._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_388._M_string_length = puVar3[1];
          *puVar3 = psVar5;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_1c0 = *plVar6;
            lStack_1b8 = plVar2[3];
            local_1d0 = &local_1c0;
          }
          else {
            local_1c0 = *plVar6;
            local_1d0 = (long *)*plVar2;
          }
          local_1c8 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != paVar1) {
            operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
          }
          if (local_410 != &local_400) {
            operator_delete(local_410,local_400 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if (local_368 != &local_358) {
            operator_delete(local_368,local_358 + 1);
          }
          if (local_3a8 != &local_398) {
            operator_delete(local_3a8,local_398 + 1);
          }
          if (local_340 != &local_330) {
            operator_delete(local_340,local_330 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_290 != &local_280) {
            operator_delete(local_290,local_280 + 1);
          }
          if (local_2b0 != &local_2a0) {
            operator_delete(local_2b0,local_2a0 + 1);
          }
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0,local_1e0 + 1);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,local_200 + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          uVar9 = local_50.field_2._M_allocated_capacity;
          _Var10._M_p = local_50._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0130b754:
            operator_delete(_Var10._M_p,uVar9 + 1);
          }
        }
      }
      else if (local_341 != 0) {
        std::operator+(&local_250,"\tmediump vec3 directionToLight",&local_3e8);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_2f0 = &local_2e0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_2e0 = *plVar6;
          lStack_2d8 = plVar2[3];
        }
        else {
          local_2e0 = *plVar6;
          local_2f0 = (long *)*plVar2;
        }
        local_2e8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2f0,(ulong)local_3e8._M_dataplus._M_p);
        local_2d0 = &local_2c0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_2c0 = *plVar6;
          lStack_2b8 = plVar2[3];
        }
        else {
          local_2c0 = *plVar6;
          local_2d0 = (long *)*plVar2;
        }
        local_2c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_2b0 = &local_2a0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_2a0 = *plVar6;
          lStack_298 = plVar2[3];
        }
        else {
          local_2a0 = *plVar6;
          local_2b0 = (long *)*plVar2;
        }
        local_2a8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2b0,(ulong)local_3e8._M_dataplus._M_p);
        local_290 = &local_280;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_280 = *plVar6;
          lStack_278 = plVar2[3];
        }
        else {
          local_280 = *plVar6;
          local_290 = (long *)*plVar2;
        }
        local_288 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_270 = &local_260;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_260 = *plVar6;
          lStack_258 = plVar2[3];
        }
        else {
          local_260 = *plVar6;
          local_270 = (long *)*plVar2;
        }
        local_268 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)local_3e8._M_dataplus._M_p);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_318.field_2._M_allocated_capacity = *psVar5;
          local_318.field_2._8_8_ = plVar2[3];
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar5;
          local_318._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_318._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_340 = &local_330;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_330 = *plVar6;
          lStack_328 = plVar2[3];
        }
        else {
          local_330 = *plVar6;
          local_340 = (long *)*plVar2;
        }
        local_338 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_340,(ulong)local_3e8._M_dataplus._M_p);
        local_3a8 = &local_398;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_398 = *puVar4;
          lStack_390 = plVar2[3];
        }
        else {
          local_398 = *puVar4;
          local_3a8 = (ulong *)*plVar2;
        }
        local_3a0 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_368 = &local_358;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_358 = *plVar6;
          lStack_350 = plVar2[3];
        }
        else {
          local_358 = *plVar6;
          local_368 = (long *)*plVar2;
        }
        local_360 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_368,(ulong)local_3e8._M_dataplus._M_p);
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_3c8.field_2._M_allocated_capacity = *psVar5;
          local_3c8.field_2._8_8_ = plVar2[3];
        }
        else {
          local_3c8.field_2._M_allocated_capacity = *psVar5;
          local_3c8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_3c8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_410 = &local_400;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_400 = *puVar4;
          lStack_3f8 = plVar2[3];
        }
        else {
          local_400 = *puVar4;
          local_410 = (ulong *)*plVar2;
        }
        local_408 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_410,(ulong)local_3e8._M_dataplus._M_p);
        psVar5 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_388.field_2._M_allocated_capacity = *psVar5;
          local_388.field_2._8_8_ = puVar3[3];
          local_388._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_388.field_2._M_allocated_capacity = *psVar5;
          local_388._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_388._M_string_length = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_388);
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_1c0 = *plVar6;
          lStack_1b8 = plVar2[3];
          local_1d0 = &local_1c0;
        }
        else {
          local_1c0 = *plVar6;
          local_1d0 = (long *)*plVar2;
        }
        local_1c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_1d0);
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0,local_1c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != paVar1) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (local_410 != &local_400) {
          operator_delete(local_410,local_400 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340,local_330 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0,local_2a0 + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        uVar9 = local_250.field_2._M_allocated_capacity;
        _Var10._M_p = local_250._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) goto LAB_0130b754;
      }
      std::__cxx11::string::append((char *)local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      iVar7 = iVar7 + 1;
    } while (local_320 != iVar7);
  }
  std::__cxx11::string::append((char *)local_3f0);
  return local_3f0;
}

Assistant:

static string lightVertexTemplate (int numLights, bool isVertexCase, LightType lightType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"in highp vec4 a_position${NAME_SPEC};\n"
		"in mediump vec3 a_normal${NAME_SPEC};\n"
		"in mediump vec4 a_texCoord0${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_ambientColor${NAME_SPEC};\n"
		"uniform mediump vec4 u_material_diffuseColor${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_emissiveColor${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_specularColor${NAME_SPEC};\n"
		"uniform mediump float u_material_shininess${NAME_SPEC};\n";

	for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
	{
		string ndxStr = de::toString(lightNdx);

		resultTemplate +=
			"uniform mediump vec3 u_light" + ndxStr + "_color${NAME_SPEC};\n"
			"uniform mediump vec3 u_light" + ndxStr + "_direction${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"uniform mediump vec4 u_light" + ndxStr + "_position${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_constantAttenuation${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_linearAttenuation${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC};\n";
	}

	resultTemplate +=
		"uniform highp mat4 u_mvpMatrix${NAME_SPEC};\n"
		"uniform highp mat4 u_modelViewMatrix${NAME_SPEC};\n"
		"uniform mediump mat3 u_normalMatrix${NAME_SPEC};\n"
		"uniform mediump mat4 u_texCoordMatrix0${NAME_SPEC};\n"
		"out mediump vec4 v_color${NAME_SPEC};\n"
		"out mediump vec2 v_texCoord0${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate += "out mediump vec3 v_eyeNormal${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"out mediump vec3 v_directionToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n"
				"out mediump float v_distanceToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n";
	}

	resultTemplate +=
		"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
		"{\n"
		"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
		"}\n"
		"\n"
		"mediump vec3 computeLighting (\n"
		"	mediump vec3 directionToLight,\n"
		"	mediump vec3 halfVector,\n"
		"	mediump vec3 normal,\n"
		"	mediump vec3 lightColor,\n"
		"	mediump vec3 diffuseColor,\n"
		"	mediump vec3 specularColor,\n"
		"	mediump float shininess)\n"
		"{\n"
		"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
		"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
		"\n"
		"	if (normalDotDirection != 0.0)\n"
		"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
		"\n"
		"	return color;\n"
		"}\n"
		"\n";

	if (lightType == LIGHT_POINT)
		resultTemplate +=
			"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
			"{\n"
			"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
			"}\n"
			"\n";

	resultTemplate +=
		"void main (void)\n"
		"{\n"
		"	highp vec4 position = a_position${NAME_SPEC};\n"
		"	highp vec3 normal = a_normal${NAME_SPEC};\n"
		"	gl_Position = u_mvpMatrix${NAME_SPEC} * position * (0.95 + 0.05*${FLOAT01});\n"
		"	v_texCoord0${NAME_SPEC} = (u_texCoordMatrix0${NAME_SPEC} * a_texCoord0${NAME_SPEC}).xy;\n"
		"	mediump vec4 color = vec4(u_material_emissiveColor${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.a);\n"
		"\n"
		"	highp vec4 eyePosition = u_modelViewMatrix${NAME_SPEC} * position;\n"
		"	mediump vec3 eyeNormal = normalize(u_normalMatrix${NAME_SPEC} * normal);\n";

	if (!isVertexCase)
		resultTemplate += "\tv_eyeNormal${NAME_SPEC} = eyeNormal;\n";

	resultTemplate += "\n";

	for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
	{
		string ndxStr = de::toString(lightNdx);

		resultTemplate +=
			"	/* Light " + ndxStr + " */\n";

		if (lightType == LIGHT_POINT)
		{
			resultTemplate +=
				"	mediump float distanceToLight" + ndxStr + " = distance(eyePosition, u_light" + ndxStr + "_position${NAME_SPEC});\n"
				"	mediump vec3 directionToLight" + ndxStr + " = normalize(direction(eyePosition, u_light" + ndxStr + "_position${NAME_SPEC}));\n";

			if (isVertexCase)
				resultTemplate +=
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, "
					"u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight" + ndxStr + ", u_light" + ndxStr + "_constantAttenuation${NAME_SPEC}, "
					"u_light" + ndxStr + "_linearAttenuation${NAME_SPEC}, u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC});\n";
			else
				resultTemplate +=
					"	v_directionToLight${NAME_SPEC}[" + ndxStr + "] = directionToLight" + ndxStr + ";\n"
					"	v_distanceToLight${NAME_SPEC}[" + ndxStr + "]  = distanceToLight" + ndxStr + ";\n";
		}
		else if (lightType == LIGHT_DIRECTIONAL)
		{
			if (isVertexCase)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = -u_light" + ndxStr + "_direction${NAME_SPEC};\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n";
		}
		else
			DE_ASSERT(DE_FALSE);

		resultTemplate += "\n";
	}

	resultTemplate +=
		"	v_color${NAME_SPEC} = color;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}